

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManStop(Tim_Man_t *p)

{
  void *__ptr;
  int i;
  int i_00;
  Vec_Ptr_t *pVVar1;
  
  pVVar1 = p->vDelayTables;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    for (i_00 = 0; i_00 < pVVar1->nSize; i_00 = i_00 + 1) {
      __ptr = Vec_PtrEntry(pVVar1,i_00);
      if ((void *)0x2 < __ptr) {
        free(__ptr);
      }
    }
    Vec_PtrFree(pVVar1);
  }
  pVVar1 = p->vBoxes;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vBoxes->pArray = (void **)0x0;
      pVVar1 = p->vBoxes;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_0038ba32;
    }
    free(pVVar1);
    p->vBoxes = (Vec_Ptr_t *)0x0;
  }
LAB_0038ba32:
  Mem_FlexStop(p->pMemObj,0);
  if (p->pCis != (Tim_Obj_t *)0x0) {
    free(p->pCis);
    p->pCis = (Tim_Obj_t *)0x0;
  }
  free(p->pCos);
  free(p);
  return;
}

Assistant:

void Tim_ManStop( Tim_Man_t * p )
{
    Vec_PtrFreeFree( p->vDelayTables );
    Vec_PtrFreeP( &p->vBoxes );
    Mem_FlexStop( p->pMemObj, 0 );
    ABC_FREE( p->pCis );
    ABC_FREE( p->pCos );
    ABC_FREE( p );
}